

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall
Memory::HeapBlockMap32::VerifyMarkCountForPages<256u>
          (HeapBlockMap32 *this,void *address,uint pageCount)

{
  uint uVar1;
  L2MapChunk *this_00;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BVIndex BVar5;
  BVStatic<256UL> *this_01;
  uint uVar6;
  long lVar7;
  uint uVar8;
  BVIndex startOffset;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x15e,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar4) goto LAB_0021780e;
    *puVar2 = 0;
  }
  uVar8 = (uint)address >> 0xc;
  uVar6 = uVar8 & 0xff;
  uVar1 = uVar6 + pageCount;
  if (0x100 < uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x162,"(id2 + pageCount <= L2Count)","id2 + pageCount <= L2Count");
    if (!bVar4) {
LAB_0021780e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  if (uVar6 < uVar1) {
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    uVar8 = uVar8 & 0xff;
    startOffset = uVar8 << 8;
    lVar7 = 0;
    do {
      this_01 = BVStatic<65536ul>::GetRange<256ul>((BVStatic<65536ul> *)this_00,startOffset);
      BVar5 = BVStatic<256UL>::Count(this_01);
      if (BVar5 != this_00->pageMarkCount[(ulong)uVar8 + lVar7]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                           ,0x16a,"(markCountForPage == l2map->pageMarkCount[i])",
                           "markCountForPage == l2map->pageMarkCount[i]");
        if (!bVar4) goto LAB_0021780e;
        *puVar2 = 0;
      }
      lVar7 = lVar7 + 1;
      startOffset = startOffset + 0x100;
    } while (pageCount != (uint)lVar7);
  }
  return;
}

Assistant:

void
HeapBlockMap32::VerifyMarkCountForPages(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    Assert(id2 + pageCount <= L2Count);
    for (uint i = id2; i < pageCount + id2; i++)
    {
        uint markCountForPage = l2map->GetPageMarkBitVector(i)->Count();
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
        Assert(markCountForPage == l2map->pageMarkCount[i] || heapBlock->WasAllocatedFromDuringSweep());
#else
        Assert(markCountForPage == l2map->pageMarkCount[i]);
#endif
    }
}